

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTexture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmTextureCalc::GetCompressionBlockDimensions
          (GmmTextureCalc *this,GMM_RESOURCE_FORMAT Format,uint32_t *pWidth,uint32_t *pHeight,
          uint32_t *pDepth)

{
  GMM_PLATFORM_INFO *pGVar1;
  uint32_t *pDepth_local;
  uint32_t *pHeight_local;
  uint32_t *pWidth_local;
  GMM_RESOURCE_FORMAT Format_local;
  GmmTextureCalc *this_local;
  
  if (((pWidth != (uint32_t *)0x0) && (pHeight != (uint32_t *)0x0)) && (pDepth != (uint32_t *)0x0))
  {
    if (((int)Format < 1) || (0x180 < (int)Format)) {
      *pWidth = 1;
      *pHeight = 1;
      *pDepth = 1;
    }
    else {
      pGVar1 = Context::GetPlatformInfo(this->pGmmLibContext);
      *pWidth = (uint)pGVar1->FormatTable[Format].Element.Width;
      pGVar1 = Context::GetPlatformInfo(this->pGmmLibContext);
      *pHeight = (uint)pGVar1->FormatTable[Format].Element.Height;
      pGVar1 = Context::GetPlatformInfo(this->pGmmLibContext);
      *pDepth = (uint)pGVar1->FormatTable[Format].Element.Depth;
    }
  }
  return;
}

Assistant:

void GmmLib::GmmTextureCalc::GetCompressionBlockDimensions(GMM_RESOURCE_FORMAT Format,
                                                           uint32_t *          pWidth,
                                                           uint32_t *          pHeight,
                                                           uint32_t *          pDepth)
{

    GMM_DPF_ENTER;
    __GMM_ASSERT(pWidth && pHeight && pDepth);

    if(pWidth && pHeight && pDepth)
    {
        if((Format > GMM_FORMAT_INVALID) && (Format < GMM_RESOURCE_FORMATS))
        {
            *pWidth  = pGmmLibContext->GetPlatformInfo().FormatTable[Format].Element.Width;
            *pHeight = pGmmLibContext->GetPlatformInfo().FormatTable[Format].Element.Height;
            *pDepth  = pGmmLibContext->GetPlatformInfo().FormatTable[Format].Element.Depth;
        }
        else
        {
            *pWidth  = 1;
            *pHeight = 1;
            *pDepth  = 1;
        }
    }
    GMM_DPF_EXIT;
}